

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Agent.cpp
# Opt level: O2

void RVO::linearProgram4(vector<RVO::Plane,_std::allocator<RVO::Plane>_> *planes,size_t numObstacles
                        ,size_t beginPlane,float radius,Vector3 *result)

{
  undefined8 uVar1;
  undefined8 uVar2;
  __normal_iterator<const_RVO::Plane_*,_std::vector<RVO::Plane,_std::allocator<RVO::Plane>_>_>
  __first;
  pointer pPVar3;
  long lVar4;
  size_t j;
  size_t sVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  Vector3 lineNormal;
  value_type local_b8;
  vector<RVO::Plane,_std::allocator<RVO::Plane>_> projPlanes;
  Vector3 local_68;
  undefined8 local_58;
  undefined8 uStack_50;
  Vector3 crossProduct;
  
  fVar6 = 0.0;
  do {
    __first._M_current =
         (planes->super__Vector_base<RVO::Plane,_std::allocator<RVO::Plane>_>)._M_impl.
         super__Vector_impl_data._M_start;
    if ((ulong)(((long)(planes->super__Vector_base<RVO::Plane,_std::allocator<RVO::Plane>_>)._M_impl
                       .super__Vector_impl_data._M_finish - (long)__first._M_current) / 0x18) <=
        beginPlane) {
      return;
    }
    if (fVar6 < (__first._M_current[beginPlane].point.val_[2] - result->val_[2]) *
                __first._M_current[beginPlane].normal.val_[2] +
                (__first._M_current[beginPlane].point.val_[0] - result->val_[0]) *
                __first._M_current[beginPlane].normal.val_[0] +
                (__first._M_current[beginPlane].point.val_[1] - result->val_[1]) *
                __first._M_current[beginPlane].normal.val_[1]) {
      std::vector<RVO::Plane,std::allocator<RVO::Plane>>::
      vector<__gnu_cxx::__normal_iterator<RVO::Plane_const*,std::vector<RVO::Plane,std::allocator<RVO::Plane>>>,void>
                ((vector<RVO::Plane,std::allocator<RVO::Plane>> *)&projPlanes,__first,
                 __first._M_current + numObstacles,(allocator_type *)&local_b8);
      lVar4 = numObstacles * 0x18 + 0xc;
      for (sVar5 = numObstacles; sVar5 < beginPlane; sVar5 = sVar5 + 1) {
        local_b8.normal.val_[1] = 0.0;
        local_b8.normal.val_[2] = 0.0;
        local_b8.point.val_[0] = 0.0;
        local_b8.point.val_[1] = 0.0;
        local_b8.point.val_[2] = 0.0;
        local_b8.normal.val_[0] = 0.0;
        pPVar3 = (planes->super__Vector_base<RVO::Plane,_std::allocator<RVO::Plane>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        cross((Vector3 *)((long)(pPVar3->point).val_ + lVar4),&pPVar3[beginPlane].normal);
        fVar6 = absSq(&crossProduct);
        if (fVar6 <= 1e-05) {
          pPVar3 = (planes->super__Vector_base<RVO::Plane,_std::allocator<RVO::Plane>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          fVar6 = Vector3::operator*(&pPVar3[beginPlane].normal,
                                     (Vector3 *)((long)(pPVar3->point).val_ + lVar4));
          if (fVar6 <= 0.0) {
            pPVar3 = (planes->super__Vector_base<RVO::Plane,_std::allocator<RVO::Plane>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            local_b8.point.val_[2] =
                 (pPVar3[beginPlane].point.val_[2] +
                 *(float *)((long)(pPVar3->point).val_ + lVar4 + -4)) * 0.5;
            uVar1 = *(undefined8 *)pPVar3[beginPlane].point.val_;
            uVar2 = *(undefined8 *)((long)(&pPVar3->point + -1) + lVar4);
            local_b8.point.val_[0] = ((float)uVar2 + (float)uVar1) * 0.5;
            local_b8.point.val_[1] =
                 ((float)((ulong)uVar2 >> 0x20) + (float)((ulong)uVar1 >> 0x20)) * 0.5;
            goto LAB_001071d5;
          }
        }
        else {
          cross(&crossProduct,
                &(planes->super__Vector_base<RVO::Plane,_std::allocator<RVO::Plane>_>)._M_impl.
                 super__Vector_impl_data._M_start[beginPlane].normal);
          pPVar3 = (planes->super__Vector_base<RVO::Plane,_std::allocator<RVO::Plane>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          local_b8.point.val_[2] = pPVar3[beginPlane].point.val_[2];
          uVar1 = *(undefined8 *)pPVar3[beginPlane].point.val_;
          fVar8 = (float)uVar1;
          fVar10 = (float)((ulong)uVar1 >> 0x20);
          fVar6 = *(float *)((long)(pPVar3->point).val_ + lVar4 + 4);
          fVar9 = *(float *)((long)(pPVar3->point).val_ + lVar4);
          fVar7 = *(float *)((long)(pPVar3->point).val_ + lVar4 + 8);
          fVar6 = (fVar7 * (*(float *)((long)(pPVar3->point).val_ + lVar4 + -4) -
                           local_b8.point.val_[2]) +
                  fVar9 * (*(float *)((long)(&pPVar3->point + -1) + lVar4) - fVar8) +
                  fVar6 * (*(float *)((long)(pPVar3->point).val_ + lVar4 + -8) - fVar10)) /
                  (fVar7 * lineNormal.val_[2] +
                  fVar9 * lineNormal.val_[0] + fVar6 * lineNormal.val_[1]);
          local_b8.point.val_[2] = lineNormal.val_[2] * fVar6 + local_b8.point.val_[2];
          local_b8.point.val_[1] = fVar6 * lineNormal.val_[1] + fVar10;
          local_b8.point.val_[0] = fVar6 * lineNormal.val_[0] + fVar8;
LAB_001071d5:
          local_68.val_[2] =
               *(float *)((long)(pPVar3->point).val_ + lVar4 + 8) -
               pPVar3[beginPlane].normal.val_[2];
          uVar1 = *(undefined8 *)((long)(pPVar3->point).val_ + lVar4);
          uVar2 = *(undefined8 *)pPVar3[beginPlane].normal.val_;
          local_68.val_[0] = (float)uVar1 - (float)uVar2;
          local_68.val_[1] = (float)((ulong)uVar1 >> 0x20) - (float)((ulong)uVar2 >> 0x20);
          normalize((RVO *)&lineNormal,&local_68);
          local_b8.normal.val_[2] = lineNormal.val_[2];
          local_b8.normal.val_[0] = lineNormal.val_[0];
          local_b8.normal.val_[1] = lineNormal.val_[1];
          std::vector<RVO::Plane,_std::allocator<RVO::Plane>_>::push_back(&projPlanes,&local_b8);
        }
        lVar4 = lVar4 + 0x18;
      }
      local_58 = *(undefined8 *)result->val_;
      uStack_50 = 0;
      fVar6 = result->val_[2];
      sVar5 = linearProgram3(&projPlanes,radius,
                             &(planes->super__Vector_base<RVO::Plane,_std::allocator<RVO::Plane>_>).
                              _M_impl.super__Vector_impl_data._M_start[beginPlane].normal,true,
                             result);
      if (sVar5 < (ulong)(((long)projPlanes.
                                 super__Vector_base<RVO::Plane,_std::allocator<RVO::Plane>_>._M_impl
                                 .super__Vector_impl_data._M_finish -
                          (long)projPlanes.
                                super__Vector_base<RVO::Plane,_std::allocator<RVO::Plane>_>._M_impl.
                                super__Vector_impl_data._M_start) / 0x18)) {
        result->val_[0] = (float)local_58;
        result->val_[1] = local_58._4_4_;
        result->val_[2] = fVar6;
        fVar7 = local_58._4_4_;
        fVar9 = (float)local_58;
      }
      else {
        fVar9 = result->val_[0];
        fVar7 = result->val_[1];
        fVar6 = result->val_[2];
      }
      pPVar3 = (planes->super__Vector_base<RVO::Plane,_std::allocator<RVO::Plane>_>)._M_impl.
               super__Vector_impl_data._M_start;
      fVar6 = (pPVar3[beginPlane].point.val_[2] - fVar6) * pPVar3[beginPlane].normal.val_[2] +
              (pPVar3[beginPlane].point.val_[0] - fVar9) * pPVar3[beginPlane].normal.val_[0] +
              (pPVar3[beginPlane].point.val_[1] - fVar7) * pPVar3[beginPlane].normal.val_[1];
      std::_Vector_base<RVO::Plane,_std::allocator<RVO::Plane>_>::~_Vector_base
                (&projPlanes.super__Vector_base<RVO::Plane,_std::allocator<RVO::Plane>_>);
    }
    beginPlane = beginPlane + 1;
  } while( true );
}

Assistant:

void linearProgram4(const std::vector<Plane> &planes, size_t numObstacles, size_t beginPlane, float radius, Vector3 &result)
	{
		float distance = 0.0f;

		for (size_t i = beginPlane; i < planes.size(); ++i) {
			if (planes[i].normal * (planes[i].point - result) > distance) {
				/* Result does not satisfy constraint of plane i. */
				std::vector<Plane> projPlanes(planes.begin(), planes.begin() + static_cast<ptrdiff_t>(numObstacles));

				for (size_t j = numObstacles; j < i; ++j) {
					Plane plane;

					const Vector3 crossProduct = cross(planes[j].normal, planes[i].normal);

					if (absSq(crossProduct) <= RVO_EPSILON) {
						/* Plane i and plane j are (almost) parallel. */
						if (planes[i].normal * planes[j].normal > 0.0f) {
							/* Plane i and plane j point in the same direction. */
							continue;
						}
						else {
							/* Plane i and plane j point in opposite direction. */
							plane.point = 0.5f * (planes[i].point + planes[j].point);
						}
					}
					else {
						/* Plane.point is point on line of intersection between plane i and plane j. */
						const Vector3 lineNormal = cross(crossProduct, planes[i].normal);
						plane.point = planes[i].point + (((planes[j].point - planes[i].point) * planes[j].normal) / (lineNormal * planes[j].normal)) * lineNormal;
					}

					plane.normal = normalize(planes[j].normal - planes[i].normal);
					projPlanes.push_back(plane);
				}

				const Vector3 tempResult = result;

				if (linearProgram3(projPlanes, radius, planes[i].normal, true, result) < projPlanes.size()) {
					/* This should in principle not happen.  The result is by definition already in the feasible region of this linear program. If it fails, it is due to small floating point error, and the current result is kept. */
					result = tempResult;
				}

				distance = planes[i].normal * (planes[i].point - result);
			}
		}
	}